

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int cm_zlib_gzungetc(int c,gzFile file)

{
  gz_stream *s;
  gzFile file_local;
  int c_local;
  
  if ((((file == (gzFile)0x0) || (*(char *)((long)file + 0xac) != 'r')) || (c == -1)) ||
     (*(int *)((long)file + 200) != -1)) {
    file_local._4_4_ = -1;
  }
  else {
    *(int *)((long)file + 200) = c;
    *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + -1;
    *(uint *)((long)file + 0xcc) = (uint)(*(int *)((long)file + 0x70) == 1);
    if (*(int *)((long)file + 0xcc) != 0) {
      *(undefined4 *)((long)file + 0x70) = 0;
    }
    *(undefined4 *)((long)file + 0x74) = 0;
    file_local._4_4_ = c;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzungetc(c, file)
    int c;
    gzFile file;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'r' || c == EOF || s->back != EOF) return EOF;
    s->back = c;
    s->out--;
    s->last = (s->z_err == Z_STREAM_END);
    if (s->last) s->z_err = Z_OK;
    s->z_eof = 0;
    return c;
}